

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,float kappa,float delta,float theta,float obj_amp)

{
  solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>
  *reduced_cost;
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint r_size;
  int selected;
  long lVar4;
  int iVar5;
  _Head_base<0UL,_int_*,_false> _Var6;
  long lVar7;
  int *piVar8;
  rc_data *ret_1;
  rc_data *prVar9;
  rc_data *prVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  rc_data *ret;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_50;
  _Head_base<0UL,_int_*,_false> local_48;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  undefined8 local_38;
  
  if (first._M_current == last._M_current) {
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
  }
  else {
    local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 0x10);
    reduced_cost = this + 0x60;
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
    do {
      k = (first._M_current)->first;
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)&local_50,
                 (int)local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_48._M_head_impl !=
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar7 = *(long *)(this + 0x50);
        _Var6._M_head_impl = local_48._M_head_impl;
        do {
          *(float *)(lVar7 + (long)*_Var6._M_head_impl * 4) =
               theta * *(float *)(lVar7 + (long)*_Var6._M_head_impl * 4);
          _Var6._M_head_impl = _Var6._M_head_impl + 8;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)_Var6._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      r_size = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                           *)this,(row_iterator)local_48._M_head_impl,
                          (row_iterator)
                          local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      if (r_size != 0) {
        lVar7 = *(long *)(this + 0x60);
        lVar4 = *(long *)(*(long *)(this + 0x160) + 8);
        lVar13 = 0;
        do {
          auVar2 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar4 + (long)((row_iterator)
                                                                   ((long)local_48._M_head_impl +
                                                                   (long)*(int *)(lVar7 + 4 + lVar13
                                                                                 ) * 8))->column * 4
                                                    )),ZEXT416((uint)obj_amp),
                                   ZEXT416(*(uint *)(lVar7 + lVar13)));
          *(int *)(lVar7 + lVar13) = auVar2._0_4_;
          lVar13 = lVar13 + 0xc;
        } while ((ulong)r_size * 0xc != lVar13);
      }
      lVar7 = (long)k;
      switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar7)) {
      case 0:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar10 = *(rc_data **)(this + 0x60);
          lVar4 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar4,(int)LZCOUNT(lVar4) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar4);
          prVar9 = prVar10 + 1;
          lVar4 = lVar4 * 0xc + -0xc;
          do {
            if ((prVar10->value != prVar9->value) || (NAN(prVar10->value) || NAN(prVar9->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar10,prVar9,plVar1);
              prVar10 = prVar9;
            }
            prVar9 = prVar9 + 1;
            lVar4 = lVar4 + -0xc;
          } while (lVar4 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar10,prVar9,plVar1);
        }
        iVar5 = *(int *)(*(long *)(this + 0x70) + lVar7 * 0xc);
        iVar12 = *(int *)(*(long *)(this + 0x70) + 4 + lVar7 * 0xc);
LAB_00511489:
        selected = branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>>
                             ((branch_and_bound_solver<baryonyx::itm::minimize_tag,float> *)
                              (this + 0x80),
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                               *)reduced_cost,r_size,iVar5,iVar12);
        break;
      case 1:
switchD_00511084_caseD_1:
        selected = exhaustive_solver<baryonyx::itm::minimize_tag,float>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>>>
                             ((exhaustive_solver<baryonyx::itm::minimize_tag,float> *)(this + 0xe8),
                              k,(unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
                                 *)reduced_cost,r_size);
        break;
      case 2:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar10 = *(rc_data **)(this + 0x60);
          lVar4 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar4,(int)LZCOUNT(lVar4) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar4);
          prVar9 = prVar10 + 1;
          lVar4 = lVar4 * 0xc + -0xc;
          do {
            if ((prVar10->value != prVar9->value) || (NAN(prVar10->value) || NAN(prVar9->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar10,prVar9,plVar1);
              prVar10 = prVar9;
            }
            prVar9 = prVar9 + 1;
            lVar4 = lVar4 + -0xc;
          } while (lVar4 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar10,prVar9,plVar1);
        }
        iVar5 = *(int *)(*(long *)(this + 0x70) + lVar7 * 0xc);
        iVar12 = *(int *)(*(long *)(this + 0x70) + 4 + lVar7 * 0xc);
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          piVar8 = (int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>,_true,_true>
                                   *)reduced_cost + 8);
          iVar11 = 0;
          selected = -2;
          uVar15 = 0xffffffffffffffff;
          do {
            iVar14 = (int)uVar15;
            if (iVar12 < iVar11) {
              iVar14 = selected;
            }
            if (iVar11 < iVar5) {
              iVar14 = selected;
            }
            selected = iVar14;
            if ((selected != -2) && (0.0 < (float)piVar8[-2])) break;
            uVar15 = uVar15 + 1;
            iVar11 = iVar11 + *piVar8;
            piVar8 = piVar8 + 3;
          } while (r_size != uVar15);
        }
        if (selected == -2) goto LAB_00511489;
        break;
      case 3:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar10 = *(rc_data **)(this + 0x60);
          lVar4 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar4,(int)LZCOUNT(lVar4) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar4);
          prVar9 = prVar10 + 1;
          lVar4 = lVar4 * 0xc + -0xc;
          do {
            if ((prVar10->value != prVar9->value) || (NAN(prVar10->value) || NAN(prVar9->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar10,prVar9,plVar1);
              prVar10 = prVar9;
            }
            prVar9 = prVar9 + 1;
            lVar4 = lVar4 + -0xc;
          } while (lVar4 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar10,prVar9,plVar1);
        }
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          piVar8 = (int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>,_true,_true>
                                   *)reduced_cost + 8);
          iVar12 = 0;
          uVar15 = 0xffffffffffffffff;
          iVar5 = -2;
          do {
            selected = (int)uVar15;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar7 * 0xc) < iVar12) {
              selected = iVar5;
            }
            if (iVar12 < *(int *)(*(long *)(this + 0x70) + lVar7 * 0xc)) {
              selected = iVar5;
            }
            if ((selected != -2) && (0.0 < (float)piVar8[-2])) break;
            uVar15 = uVar15 + 1;
            iVar12 = iVar12 + *piVar8;
            piVar8 = piVar8 + 3;
            iVar5 = selected;
          } while (r_size != uVar15);
        }
        if (selected == -2) goto switchD_00511084_caseD_1;
        break;
      default:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar10 = *(rc_data **)(this + 0x60);
          lVar4 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar4,(int)LZCOUNT(lVar4) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar4);
          prVar9 = prVar10 + 1;
          lVar4 = lVar4 * 0xc + -0xc;
          do {
            if ((prVar10->value != prVar9->value) || (NAN(prVar10->value) || NAN(prVar9->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar10,prVar9,plVar1);
              prVar10 = prVar9;
            }
            prVar9 = prVar9 + 1;
            lVar4 = lVar4 + -0xc;
          } while (lVar4 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar10,prVar9,plVar1);
        }
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          piVar8 = (int *)(*(long *)(this + 0x60) + 8);
          iVar12 = 0;
          uVar15 = 0xffffffffffffffff;
          iVar5 = -2;
          do {
            selected = (int)uVar15;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar7 * 0xc) < iVar12) {
              selected = iVar5;
            }
            if (iVar12 < *(int *)(*(long *)(this + 0x70) + lVar7 * 0xc)) {
              selected = iVar5;
            }
            if ((selected != -2) && (0.0 < (float)piVar8[-2])) break;
            uVar15 = uVar15 + 1;
            iVar12 = iVar12 + *piVar8;
            piVar8 = piVar8 + 3;
            iVar5 = selected;
          } while (r_size != uVar15);
        }
      }
      bVar3 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                        (this,x,(row_value *)local_48._M_head_impl,k,selected,r_size,kappa,delta);
      local_38._0_1_ = (byte)local_38 | bVar3;
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
  }
  return (bool)((byte)local_38 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            Float pi_change;
            int selected;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
            default:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }